

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BetweenTests.cpp
# Opt level: O0

void __thiscall IsBetweenTests::IsBetweenTests(IsBetweenTests *this)

{
  IsBetweenTests *this_local;
  
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__IsBetweenTests_00613d50;
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Between(5,10)(7) is True", []()
		{
			AssertThat(ut11::Is::Between(5, 10)(7), ut11::Is::True);
		});

		Then("Is::Between(5,10)(12) is False", []()
		{
			AssertThat(ut11::Is::Between(5, 10)(12), ut11::Is::False);
		});

		Then("Is::Between(5,10)(3) is False", []()
		{
			AssertThat(ut11::Is::Between(5, 10)(3), ut11::Is::False);
		});

		Then("Is::Between is an operand", []()
		{
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Between(5,10)) >::value, ut11::Is::True);
		});

		Then("Is::Between has an error message", []() {
			AssertThat(ut11::Is::Between(5, 10).GetErrorMessage(12), ut11::Is::Not::EqualTo(""));
		});
	}